

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall kratos::UnusedTopBlockVisitor::~UnusedTopBlockVisitor(UnusedTopBlockVisitor *this)

{
  UnusedTopBlockVisitor *this_local;
  
  ~UnusedTopBlockVisitor(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* generator) override {
        std::set<std::shared_ptr<Stmt>> blocks_to_remove = {};
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto* block = dynamic_cast<StmtBlock*>(stmt.get());
                if (block->empty()) blocks_to_remove.emplace(stmt);
            }
        }

        for (auto const& stmt : blocks_to_remove) {
            generator->remove_stmt(stmt);
        }
    }